

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void clip_image_u8_free(clip_image_u8 *img)

{
  if (img != (clip_image_u8 *)0x0) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&(img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    operator_delete(img,0x20);
    return;
  }
  return;
}

Assistant:

void clip_image_u8_free(struct clip_image_u8  * img) { if (img) delete img; }